

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O3

uint stb_vorbis_stream_length_in_samples(stb_vorbis *f)

{
  uint uVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint uVar5;
  uint last;
  uint end;
  char header [6];
  uint32 local_38;
  uint local_34;
  uint8 local_2e [6];
  
  if (f->push_mode != '\0') {
    f->error = VORBIS_invalid_api_mixing;
    return 0;
  }
  uVar1 = f->total_samples;
  if (uVar1 != 0) goto LAB_0014f057;
  uVar1 = stb_vorbis_get_file_offset(f);
  if (f->stream_len < 0x10000) {
    uVar5 = f->first_audio_page_offset;
  }
  else {
    uVar5 = f->stream_len - 0x10000;
    if (uVar5 <= f->first_audio_page_offset) {
      uVar5 = f->first_audio_page_offset;
    }
  }
  set_file_offset(f,uVar5);
  uVar2 = vorbis_find_page(f,&local_34,&local_38);
  if (uVar2 == 0) {
LAB_0014f033:
    f->error = VORBIS_cant_find_last_page;
    f->total_samples = 0xffffffff;
  }
  else {
    uVar5 = stb_vorbis_get_file_offset(f);
    if (local_38 == 0) {
      set_file_offset(f,local_34);
      uVar2 = vorbis_find_page(f,&local_34,&local_38);
      if (uVar2 != 0) {
        do {
          uVar5 = stb_vorbis_get_file_offset(f);
          if (local_38 != 0) break;
          set_file_offset(f,local_34);
          uVar2 = vorbis_find_page(f,&local_34,&local_38);
        } while (uVar2 != 0);
      }
    }
    set_file_offset(f,uVar5);
    getn(f,local_2e,6);
    uVar2 = get32(f);
    uVar3 = get32(f);
    if ((uVar3 & uVar2) == 0xffffffff) goto LAB_0014f033;
    uVar4 = 0xfffffffe;
    if (uVar3 == 0) {
      uVar4 = uVar2;
    }
    f->total_samples = uVar4;
    (f->p_last).page_start = uVar5;
    (f->p_last).page_end = local_34;
    (f->p_last).last_decoded_sample = uVar4;
  }
  set_file_offset(f,uVar1);
  uVar1 = f->total_samples;
LAB_0014f057:
  uVar5 = 0;
  if (uVar1 != 0xffffffff) {
    uVar5 = uVar1;
  }
  return uVar5;
}

Assistant:

unsigned int stb_vorbis_stream_length_in_samples(stb_vorbis *f)
{
   unsigned int restore_offset, previous_safe;
   unsigned int end, last_page_loc;

   if (IS_PUSH_MODE(f)) return error(f, VORBIS_invalid_api_mixing);
   if (!f->total_samples) {
      unsigned int last;
      uint32 lo,hi;
      char header[6];

      // first, store the current decode position so we can restore it
      restore_offset = stb_vorbis_get_file_offset(f);

      // now we want to seek back 64K from the end (the last page must
      // be at most a little less than 64K, but let's allow a little slop)
      if (f->stream_len >= 65536 && f->stream_len-65536 >= f->first_audio_page_offset)
         previous_safe = f->stream_len - 65536;
      else
         previous_safe = f->first_audio_page_offset;

      set_file_offset(f, previous_safe);
      // previous_safe is now our candidate 'earliest known place that seeking
      // to will lead to the final page'

      if (!vorbis_find_page(f, &end, &last)) {
         // if we can't find a page, we're hosed!
         f->error = VORBIS_cant_find_last_page;
         f->total_samples = 0xffffffff;
         goto done;
      }

      // check if there are more pages
      last_page_loc = stb_vorbis_get_file_offset(f);

      // stop when the last_page flag is set, not when we reach eof;
      // this allows us to stop short of a 'file_section' end without
      // explicitly checking the length of the section
      while (!last) {
         set_file_offset(f, end);
         if (!vorbis_find_page(f, &end, &last)) {
            // the last page we found didn't have the 'last page' flag
            // set. whoops!
            break;
         }
         //previous_safe = last_page_loc+1; // NOTE: not used after this point, but note for debugging
         last_page_loc = stb_vorbis_get_file_offset(f);
      }

      set_file_offset(f, last_page_loc);

      // parse the header
      getn(f, (unsigned char *)header, 6);
      // extract the absolute granule position
      lo = get32(f);
      hi = get32(f);
      if (lo == 0xffffffff && hi == 0xffffffff) {
         f->error = VORBIS_cant_find_last_page;
         f->total_samples = SAMPLE_unknown;
         goto done;
      }
      if (hi)
         lo = 0xfffffffe; // saturate
      f->total_samples = lo;

      f->p_last.page_start = last_page_loc;
      f->p_last.page_end   = end;
      f->p_last.last_decoded_sample = lo;

     done:
      set_file_offset(f, restore_offset);
   }
   return f->total_samples == SAMPLE_unknown ? 0 : f->total_samples;
}